

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connection.cpp
# Opt level: O3

KINT32 __thiscall
KDIS::NETWORK::Connection::Receive
          (Connection *this,KOCTET *Buffer,KUINT32 BufferSz,KString *SenderIp)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  ssize_t sVar4;
  char *__s;
  KException *pKVar5;
  int *piVar6;
  KCHAR8 *pKVar7;
  Connection *pCVar8;
  socklen_t iSz;
  sockaddr_in ClientAddr;
  fd_set fd;
  allocator<char> local_f9;
  timeval local_f8;
  KString local_e0;
  socklen_t local_bc;
  undefined1 local_b8 [16];
  fd_set local_a8;
  
  local_a8.fds_bits[0xe] = 0;
  local_a8.fds_bits[0xf] = 0;
  local_a8.fds_bits[0xc] = 0;
  local_a8.fds_bits[0xd] = 0;
  local_a8.fds_bits[10] = 0;
  local_a8.fds_bits[0xb] = 0;
  local_a8.fds_bits[8] = 0;
  local_a8.fds_bits[9] = 0;
  local_a8.fds_bits[6] = 0;
  local_a8.fds_bits[7] = 0;
  local_a8.fds_bits[4] = 0;
  local_a8.fds_bits[5] = 0;
  local_a8.fds_bits[2] = 0;
  local_a8.fds_bits[3] = 0;
  local_a8.fds_bits[0] = 0;
  local_a8.fds_bits[1] = 0;
  iVar3 = this->m_iSocket[1];
  iVar2 = iVar3 + 0x3f;
  if (-1 < iVar3) {
    iVar2 = iVar3;
  }
  local_a8.fds_bits[iVar2 >> 6] =
       local_a8.fds_bits[iVar2 >> 6] | 1L << ((byte)(iVar3 % 0x40) & 0x3f);
  if (this->m_bBlockingSocket == false) {
    local_f8.tv_sec = 0;
    local_f8.tv_usec = 1;
  }
  else {
    local_f8.tv_sec = (this->m_blockingTimeout).tv_sec;
    local_f8.tv_usec = (this->m_blockingTimeout).tv_usec;
  }
  iVar3 = select(iVar3 + 1,&local_a8,(fd_set *)0x0,(fd_set *)0x0,&local_f8);
  if (iVar3 != 0) {
    if (iVar3 == -1) {
      pCVar8 = (Connection *)0x30;
      pKVar5 = (KException *)__cxa_allocate_exception();
      piVar6 = __errno_location();
      pKVar7 = getErrorText(pCVar8,*piVar6);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e0,pKVar7,(allocator<char> *)local_b8);
      KException::KException(pKVar5,&local_e0,0xc);
      __cxa_throw(pKVar5,&KException::typeinfo,KException::~KException);
    }
    local_bc = 0x10;
    sVar4 = recvfrom(this->m_iSocket[1],Buffer,(ulong)BufferSz,0,(sockaddr *)local_b8,&local_bc);
    iVar3 = (int)sVar4;
    if (iVar3 == -1) {
      pCVar8 = (Connection *)0x30;
      pKVar5 = (KException *)__cxa_allocate_exception();
      piVar6 = __errno_location();
      pKVar7 = getErrorText(pCVar8,*piVar6);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,pKVar7,&local_f9);
      KException::KException(pKVar5,&local_e0,0xc);
      __cxa_throw(pKVar5,&KException::typeinfo,KException::~KException);
    }
    if (SenderIp != (KString *)0x0) {
      __s = inet_ntoa((in_addr)local_b8._4_4_);
      pcVar1 = (char *)SenderIp->_M_string_length;
      strlen(__s);
      std::__cxx11::string::_M_replace((ulong)SenderIp,0,pcVar1,(ulong)__s);
    }
  }
  return iVar3;
}

Assistant:

KINT32 Connection::Receive(KOCTET *Buffer, KUINT32 BufferSz, KString *SenderIp /*= NULL*/ ) noexcept(false)
{
    // We use fd_set to test the receive socket for readability. This is used in both blocking
    // and none blocking mode however it is primarily here for none blocking mode as it is more
    // efficient to use this method than to continuously poll the socket.
    fd_set fd;
    FD_ZERO( &fd );
    FD_SET( m_iSocket[RECEIVE_SOCK], &fd );
    timeval pTimeout;

    if( !m_bBlockingSocket )
    {
        // If we are using none blocking mode we need to set
        // a time limit to wait for the select function.
        timeval tval;
        tval.tv_sec  = 0;
        tval.tv_usec = 1;
        pTimeout = tval;
    }
    else
    {
        // Even in blocking mode, it can be useful to return
        // occasionally after a long period without data.
        // where (long period == a second or so).
        // This can make clean exits a joy and allow status messages
        // from the same thread
        pTimeout = m_blockingTimeout;
    }

    // Check the socket, do we have data waiting?
    KINT32 uiErr = select( m_iSocket[RECEIVE_SOCK] + 1, &fd, 0, 0, &pTimeout );

    if( uiErr == SOCKET_ERROR )
    {
        THROW_ERROR;
    }

    if( uiErr ) // If none zero we have data waiting
    {
        // Get data from socket
        sockaddr_in ClientAddr;
        socklen_t iSz = sizeof( ClientAddr );
        uiErr = recvfrom( m_iSocket[RECEIVE_SOCK], Buffer, BufferSz, 0, ( sockaddr * )&ClientAddr, &iSz );

        if( uiErr == SOCKET_ERROR )
        {
            THROW_ERROR;
        }

        // Do we need the sending IP address?
        if( SenderIp )
        {
            *SenderIp = inet_ntoa( ClientAddr.sin_addr );
        }
    }

    return uiErr;
}